

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemIdentifier.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::SystemIdentifier::SystemIdentifier
          (SystemIdentifier *this,SystemType T,SystemName N,SystemMode M,KBOOL ChangeIndicator,
          KBOOL AltMode4,KBOOL AltModeC)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__SystemIdentifier_002186b8;
  this->m_ui16SystemType = (KUINT16)T;
  this->m_ui16SystemName = (KUINT16)N;
  this->m_ui8SystemMode = (KUINT8)M;
  (this->field_3).m_ui8ChangeOptions =
       AltMode4 * '\x02' + ChangeIndicator | AltModeC << 2 |
       (this->field_3).m_ui8ChangeOptions & 0xf8;
  return;
}

Assistant:

SystemIdentifier::SystemIdentifier( SystemType T, SystemName N, SystemMode M, KBOOL ChangeIndicator,
                                    KBOOL AltMode4 /* = false */, KBOOL AltModeC /* = false */ ) :
    m_ui16SystemType( T ),
    m_ui16SystemName( N ),
    m_ui8SystemMode( M ),
    m_ui8ChangeIndicator( ChangeIndicator ),
    m_ui8AltMode4( AltMode4 ),
    m_ui8AltModeC( AltModeC )
{
}